

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

_Bool store_check_num(store *store,object *obj)

{
  _Bool _Var1;
  object *local_28;
  object *stock_obj;
  object *obj_local;
  store *store_local;
  
  if ((short)(ushort)store->stock_num < store->stock_size) {
    store_local._7_1_ = true;
  }
  else {
    _Var1 = store_is_merchant(store);
    if (_Var1) {
      store_local._7_1_ = true;
    }
    else {
      _Var1 = store_is_home(store);
      if (_Var1) {
        for (local_28 = store->stock; local_28 != (object *)0x0; local_28 = local_28->next) {
          _Var1 = object_mergeable(local_28,obj,OSTACK_PACK);
          if (_Var1) {
            return true;
          }
        }
      }
      else {
        for (local_28 = store->stock; local_28 != (object *)0x0; local_28 = local_28->next) {
          _Var1 = object_mergeable(local_28,obj,OSTACK_STORE);
          if (_Var1) {
            return true;
          }
        }
      }
      store_local._7_1_ = false;
    }
  }
  return store_local._7_1_;
}

Assistant:

bool store_check_num(struct store *store, const struct object *obj)
{
	struct object *stock_obj;

	/* Free space is always usable */
	if (store->stock_num < store->stock_size) return true;

	/* Merchant will take anything */
	if (store_is_merchant(store)) return true;

	/* The "home" acts like the player */
	if (store_is_home(store)) {
		for (stock_obj = store->stock; stock_obj; stock_obj = stock_obj->next) {
			/* Can the new object be combined with the old one? */
			if (object_mergeable(stock_obj, obj, OSTACK_PACK))
				return true;
		}
	} else {
		/* Normal stores do special stuff */
		for (stock_obj = store->stock; stock_obj; stock_obj = stock_obj->next) {
			/* Can the new object be combined with the old one? */
			if (object_mergeable(stock_obj, obj, OSTACK_STORE))
				return true;
		}
	}

	/* But there was no room at the inn... */
	return false;
}